

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_table.c
# Opt level: O0

int amqp_encode_table(amqp_bytes_t encoded,amqp_table_t *input,size_t *offset)

{
  amqp_bytes_t input_00;
  amqp_bytes_t encoded_00;
  amqp_bytes_t encoded_01;
  amqp_bytes_t encoded_02;
  amqp_bytes_t encoded_03;
  int iVar1;
  amqp_field_value_t *in_RCX;
  int *in_RDX;
  void *in_RDI;
  int res;
  int i;
  size_t start;
  size_t *in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffd0;
  uint32_t input_01;
  size_t *offset_00;
  
  offset_00 = *(size_t **)in_RCX;
  *(long *)in_RCX = *(long *)in_RCX + 4;
  input_01 = 0;
  while( true ) {
    if (*in_RDX <= (int)input_01) {
      encoded_02.bytes = in_RDX;
      encoded_02.len = (size_t)in_RCX;
      iVar1 = amqp_encode_32(encoded_02,offset_00,input_01);
      if (iVar1 == 0) {
        iVar1 = -0xb;
      }
      else {
        iVar1 = 0;
      }
      return iVar1;
    }
    encoded_00.bytes = in_RDX;
    encoded_00.len = (size_t)in_RCX;
    iVar1 = amqp_encode_8(encoded_00,offset_00,(uint8_t)(input_01 >> 0x18));
    if (iVar1 == 0) {
      return -0xb;
    }
    encoded_01.bytes = in_RDX;
    encoded_01.len = (size_t)in_RCX;
    input_00.len._4_4_ = input_01;
    input_00.len._0_4_ = in_stack_ffffffffffffffd0;
    input_00.bytes = offset_00;
    iVar1 = amqp_encode_bytes(encoded_01,in_stack_ffffffffffffffc8,input_00);
    if (iVar1 == 0) {
      return -0xb;
    }
    encoded_03.bytes = in_RDI;
    encoded_03.len = (size_t)in_RDX;
    in_stack_ffffffffffffffd0 = amqp_encode_field_value(encoded_03,in_RCX,offset_00);
    if (in_stack_ffffffffffffffd0 < 0) break;
    input_01 = input_01 + 1;
  }
  return in_stack_ffffffffffffffd0;
}

Assistant:

int amqp_encode_table(amqp_bytes_t encoded, amqp_table_t *input,
                      size_t *offset) {
  size_t start = *offset;
  int i, res;

  *offset += 4; /* size of the table gets filled in later on */

  for (i = 0; i < input->num_entries; i++) {
    if (!amqp_encode_8(encoded, offset, (uint8_t)input->entries[i].key.len)) {
      res = AMQP_STATUS_TABLE_TOO_BIG;
      goto out;
    }

    if (!amqp_encode_bytes(encoded, offset, input->entries[i].key)) {
      res = AMQP_STATUS_TABLE_TOO_BIG;
      goto out;
    }

    res = amqp_encode_field_value(encoded, &input->entries[i].value, offset);
    if (res < 0) {
      goto out;
    }
  }

  if (!amqp_encode_32(encoded, &start, (uint32_t)(*offset - start - 4))) {
    res = AMQP_STATUS_TABLE_TOO_BIG;
    goto out;
  }

  res = AMQP_STATUS_OK;

out:
  return res;
}